

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

void phmap::priv::map_slot_policy<int,phmap::priv::NonStandardLayout>::
     transfer<phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
               (Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *alloc,
               slot_type *new_slot,slot_type *old_slot)

{
  std::pair<const_int,_phmap::priv::NonStandardLayout>::pair(&new_slot->value,&old_slot->value);
  NonStandardLayout::~NonStandardLayout(&(old_slot->value).second);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
                         slot_type* old_slot) {
        emplace(new_slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                         std::move(old_slot->value));
        }
        destroy(alloc, old_slot);
    }